

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

void insert_helper<QStringView>(QString *str,qsizetype i,QStringView *toInsert)

{
  long newSize;
  long lVar1;
  Data *pDVar2;
  QChar *str_00;
  char16_t *pcVar3;
  bool bVar4;
  long lVar5;
  QChar *str_01;
  difference_type __d;
  qsizetype qVar6;
  size_t __n;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar6 = (str->d).size;
  lVar5 = i - qVar6;
  if (lVar5 == 0 || i < qVar6) {
    lVar5 = 0;
  }
  lVar1 = toInsert->m_size;
  newSize = qVar6 + lVar1 + lVar5;
  pDVar2 = (str->d).d;
  if ((pDVar2 != (Data *)0x0) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    bVar4 = needsReallocate(str,newSize);
    if (!bVar4) {
      QArrayDataPointer<char16_t>::detachAndGrow
                (&str->d,(uint)(i == 0),lVar1 + lVar5,(char16_t **)0x0,
                 (QArrayDataPointer<char16_t> *)0x0);
      QString::resize(str,newSize);
      pcVar3 = (str->d).ptr;
      local_58.d = (Data *)CONCAT62(local_58.d._2_6_,0x20);
      std::__fill_n_a<char16_t*,long_long,char16_t>(pcVar3 + qVar6,lVar5);
      pcVar3 = pcVar3 + i;
      if (i != qVar6 && lVar5 == 0) {
        __n = qVar6 * 2 + i * -2;
        memmove((void *)((long)(str->d).ptr + ((str->d).size * 2 - __n)),pcVar3,__n);
      }
      if (0 < lVar1) {
        memmove(pcVar3,toInsert->m_data,lVar1 * 2);
      }
      goto LAB_0014cae4;
    }
    qVar6 = (str->d).size;
  }
  str_00 = (QChar *)(str->d).ptr;
  str_01 = str_00 + i;
  if (lVar5 != 0) {
    str_01 = str_00 + qVar6;
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QArrayDataPointer<char16_t>::detachAndGrow
            (&local_58,(uint)(i == 0),newSize,(char16_t **)0x0,(QArrayDataPointer<char16_t> *)0x0);
  QString::append((QString *)&local_58,str_00,(long)str_01 - (long)str_00 >> 1);
  QString::resize((QString *)&local_58,i,(QChar)0x20);
  QString::append((QString *)&local_58,(QChar *)toInsert->m_data,toInsert->m_size);
  QString::append((QString *)&local_58,str_01,(long)(str_00 + qVar6) - (long)str_01 >> 1);
  pDVar2 = (str->d).d;
  pcVar3 = (str->d).ptr;
  (str->d).d = local_58.d;
  (str->d).ptr = local_58.ptr;
  qVar6 = (str->d).size;
  (str->d).size = local_58.size;
  local_58.d = pDVar2;
  local_58.ptr = pcVar3;
  local_58.size = qVar6;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_0014cae4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void insert_helper(QString &str, qsizetype i, const T &toInsert)
{
    auto &str_d = str.data_ptr();
    qsizetype difference = 0;
    if (Q_UNLIKELY(i > str_d.size))
        difference = i - str_d.size;
    const qsizetype oldSize = str_d.size;
    const qsizetype insert_size = toInsert.size();
    const qsizetype newSize = str_d.size + difference + insert_size;
    const auto side = i == 0 ? QArrayData::GrowsAtBeginning : QArrayData::GrowsAtEnd;

    if (str_d.needsDetach() || needsReallocate(str, newSize)) {
        const auto cbegin = str.cbegin();
        const auto cend = str.cend();
        const auto insert_start = difference == 0 ? std::next(cbegin, i) : cend;
        QString other;
        // Using detachAndGrow() so that prepend optimization works and QStringBuilder
        // unittests pass
        other.data_ptr().detachAndGrow(side, newSize, nullptr, nullptr);
        other.append(QStringView(cbegin, insert_start));
        other.resize(i, u' ');
        other.append(toInsert);
        other.append(QStringView(insert_start, cend));
        str.swap(other);
        return;
    }

    str_d.detachAndGrow(side, difference + insert_size, nullptr, nullptr);
    Q_CHECK_PTR(str_d.data());
    str.resize(newSize);

    auto begin = str_d.begin();
    auto old_end = std::next(begin, oldSize);
    std::fill_n(old_end, difference, u' ');
    auto insert_start = std::next(begin, i);
    if (difference == 0)
        std::move_backward(insert_start, old_end, str_d.end());

    using Char = std::remove_cv_t<typename T::value_type>;
    if constexpr(std::is_same_v<Char, QChar>)
        std::copy_n(reinterpret_cast<const char16_t *>(toInsert.data()), insert_size, insert_start);
    else if constexpr (std::is_same_v<Char, char16_t>)
        std::copy_n(toInsert.data(), insert_size, insert_start);
    else if constexpr (std::is_same_v<Char, char>)
        qt_from_latin1(insert_start, toInsert.data(), insert_size);
}